

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

void Curl_formclean(FormData **form_ptr)

{
  FormData *pFVar1;
  FormData *local_20;
  FormData *form;
  FormData *next;
  FormData **form_ptr_local;
  
  local_20 = *form_ptr;
  if (local_20 != (FormData *)0x0) {
    do {
      pFVar1 = local_20->next;
      if (local_20->type < FORM_CALLBACK) {
        (*Curl_cfree)(local_20->line);
      }
      (*Curl_cfree)(local_20);
      local_20 = pFVar1;
    } while (pFVar1 != (FormData *)0x0);
    *form_ptr = (FormData *)0x0;
  }
  return;
}

Assistant:

void Curl_formclean(struct FormData **form_ptr)
{
  struct FormData *next, *form;

  form = *form_ptr;
  if(!form)
    return;

  do {
    next=form->next;  /* the following form line */
    if(form->type <= FORM_CONTENT)
      free(form->line); /* free the line */
    free(form);       /* free the struct */
    form = next;
  } while(form); /* continue */

  *form_ptr = NULL;
}